

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

uint64_t __thiscall ImgfsFile::index2entryofs(ImgfsFile *this,uint ix)

{
  uint uVar1;
  pointer puVar2;
  ulong uVar3;
  undefined8 *puVar4;
  
  uVar1 = (this->_hdr).entriesperblock;
  uVar3 = (ulong)ix / (ulong)uVar1;
  puVar2 = (this->_dir2file).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->_dir2file).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar2 >> 2)) {
    return (ulong)((this->_hdr).bytesperblock * puVar2[uVar3] +
                   (ix % uVar1) * (this->_hdr).direntsize + 8);
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "unknown dirblock";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

uint64_t index2entryofs(unsigned ix)
    {
        unsigned dirblocknr= ix/_hdr.entriesperblock;
        unsigned dirblockix= ix%_hdr.entriesperblock;
        if (dirblocknr>=_dir2file.size())
            throw "unknown dirblock";

        //printf("i2entofs [ix=%d], blocknr=%d, blockix=%d -> fileblock=%d -> ofs=%08llx\n", ix, dirblocknr, dirblockix, _dir2file[dirblocknr], uint64_t(_dir2file[dirblocknr])*_hdr.bytesperblock+8+dirblockix*_hdr.direntsize);
        return _dir2file[dirblocknr]*_hdr.bytesperblock+8+dirblockix*_hdr.direntsize;
    }